

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O1

int AF_A_SorcBallOrbit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  double dVar4;
  VM_UBYTE VVar5;
  AActor *this;
  undefined8 *puVar6;
  PClass *pPVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  AActor *pAVar10;
  FState *pFVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var12;
  uint uVar13;
  VMValue *pVVar14;
  FName *label;
  char *__assertion;
  AActor *pAVar15;
  bool bVar16;
  PClass *pPVar17;
  DVector3 pos;
  FSoundID local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  DAngle local_48;
  DVector3 local_40;
  
  pPVar3 = ASorcBall::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b7d4d;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_005b7d22:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005b7d4d:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  pVVar14 = param;
  uVar13 = numparam;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
    }
    pPVar17 = (this->super_DThinker).super_DObject.Class;
    bVar16 = pPVar17 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar16;
    uVar13 = (uint)bVar16;
    pVVar14 = (VMValue *)(ulong)(pPVar17 == pPVar3 || bVar16);
    if (pPVar17 != pPVar3 && !bVar16) {
      do {
        pPVar17 = pPVar17->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar17 != (PClass *)0x0);
        if (pPVar17 == pPVar3) break;
      } while (pPVar17 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(ASorcBall))";
      goto LAB_005b7d4d;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar5 = param[1].field_0.field_3.Type, VVar5 != 0xff)) {
    if ((VVar5 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_005b7d22;
    puVar6 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar6 != (undefined8 *)0x0) {
      if (puVar6[1] == 0) {
        uVar9 = (**(code **)*puVar6)(puVar6,pVVar14,uVar13,ret);
        puVar6[1] = uVar9;
      }
      pPVar17 = (PClass *)puVar6[1];
      bVar16 = pPVar17 != (PClass *)0x0;
      if (pPVar17 != pPVar3 && bVar16) {
        do {
          pPVar17 = pPVar17->ParentClass;
          bVar16 = pPVar17 != (PClass *)0x0;
          if (pPVar17 == pPVar3) break;
        } while (pPVar17 != (PClass *)0x0);
      }
      if (!bVar16) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b7d4d;
      }
    }
  }
  if (((2 < numparam) && (VVar5 = param[2].field_0.field_3.Type, VVar5 != 0xff)) &&
     ((VVar5 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_005b7d4d;
  }
  pAVar15 = (this->target).field_0.p;
  if (pAVar15 == (AActor *)0x0) {
LAB_005b78d3:
    label = &local_4c;
LAB_005b78d8:
    label->Index = 0x83;
    pFVar11 = AActor::FindState(this,label);
    AActor::SetState(this,pFVar11,false);
    return 0;
  }
  if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_005b78d3;
  }
  pAVar15 = (this->target).field_0.p;
  iVar8 = pAVar15->args[3];
  if ((pAVar15 != (AActor *)0x0) &&
     (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->target).field_0.p = (AActor *)0x0;
    pAVar15 = (AActor *)0x0;
  }
  if (((this->target).field_0.p)->health < 1) {
    label = &local_50;
    goto LAB_005b78d8;
  }
  dVar1 = pAVar15->radius;
  dVar2 = this->radius;
  pPVar3 = this[1].super_DThinker.super_DObject.Class;
  pPVar17 = (PClass *)
            ((double)pAVar15[1].super_DThinker.super_DObject.Class +
            (double)this[1].super_DThinker.super_DObject._vptr_DObject);
  (this->Angles).Yaw.Degrees = (double)pPVar17;
  switch(iVar8) {
  case 0:
    pAVar10 = (this->target).field_0.p;
    if ((pAVar10 != (AActor *)0x0) &&
       (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->target).field_0.p = (AActor *)0x0;
      pAVar10 = (AActor *)0x0;
    }
    if (pAVar10->args[2] < pAVar10->args[4]) {
      pAVar10->args[4] = pAVar10->args[4] + -1;
    }
    else {
      pAVar10->args[3] = 5;
    }
    (*(this->super_DThinker).super_DObject._vptr_DObject[0x26])(this);
    break;
  case 1:
    A_AccelBalls(this);
    pp_Var12 = (this->super_DThinker).super_DObject._vptr_DObject;
    goto LAB_005b7b50;
  case 2:
    pPVar7 = (PClass *)pAVar15[1].super_DThinker.super_DObject._vptr_DObject;
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar8);
    }
    if (((pPVar7 != (this->super_DThinker).super_DObject.Class) || (pAVar15->args[1] < 6)) ||
       (dVar4 = (pAVar15->Angles).Yaw.Degrees,
       42.1875 <=
       ABS((double)SUB84(((double)pPVar17 - dVar4) * 11930464.711111112 + 6755399441055744.0,0) *
           8.381903171539307e-08))) {
      (*(this->super_DThinker).super_DObject._vptr_DObject[0x26])(this);
    }
    else {
      ((this->target).field_0.p)->args[3] = 3;
      ((this->target).field_0.p)->args[4] = 0;
      pAVar15[1].super_DThinker.super_DObject.Class =
           (PClass *)(dVar4 - (double)this[1].super_DThinker.super_DObject._vptr_DObject);
    }
    break;
  case 3:
    pPVar7 = (PClass *)pAVar15[1].super_DThinker.super_DObject._vptr_DObject;
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar8);
    }
    if (pPVar7 == (this->super_DThinker).super_DObject.Class) {
      if (0 < pAVar15->health) {
        local_54.Index = FName::NameManager::FindName(&FName::NameData,"Attack1",false);
        pFVar11 = AActor::FindState(pAVar15,&local_54);
        AActor::SetState(pAVar15,pFVar11,false);
      }
      (*(this->super_DThinker).super_DObject._vptr_DObject[0x25])(this);
    }
    break;
  case 5:
    pp_Var12 = (this->super_DThinker).super_DObject._vptr_DObject;
LAB_005b7b50:
    (*pp_Var12[0x26])(this);
    break;
  case 6:
    pPVar7 = (PClass *)pAVar15[1].super_DThinker.super_DObject._vptr_DObject;
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar8);
    }
    if (pPVar7 == (this->super_DThinker).super_DObject.Class) {
      iVar8 = this->special2;
      this->special2 = iVar8 + -1;
      if (iVar8 < 1) {
        pAVar15->args[3] = 4;
        if (0 < pAVar15->health) {
          local_58.Index = FName::NameManager::FindName(&FName::NameData,"Attack2",false);
          pFVar11 = AActor::FindState(pAVar15,&local_58);
          AActor::SetState(pAVar15,pFVar11,false);
        }
      }
      else {
        A_SorcOffense2(this);
      }
    }
  }
  if ((SUB84((double)pPVar17 * 11930464.711111112 + 6755399441055744.0,0) <
       SUB84((double)pPVar3 * 11930464.711111112 + 6755399441055744.0,0)) &&
     (pAVar15->args[4] == 0x19)) {
    pAVar15->args[1] = pAVar15->args[1] + 1;
    local_5c.ID = S_FindSound("SorcererBallWoosh");
    S_Sound(this,4,&local_5c,1.0,1.0);
  }
  this[1].super_DThinker.super_DObject.Class = pPVar17;
  local_48.Degrees = (double)pPVar17;
  AActor::Vec3Angle(&local_40,pAVar15,dVar1 - (dVar2 + dVar2),&local_48,
                    pAVar15->Height - pAVar15->Floorclip,false);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x22])
            (local_40.X,local_40.Y._0_4_,local_40.Z,this,1);
  this->floorz = pAVar15->floorz;
  this->ceilingz = pAVar15->ceilingz;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcBallOrbit)
{
	PARAM_ACTION_PROLOGUE_TYPE(ASorcBall);

	// [RH] If no parent, then die instead of crashing
	if (self->target == NULL)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	int mode = self->target->args[3];
	AHeresiarch *parent = barrier_cast<AHeresiarch *>(self->target);
	double dist = parent->radius - (self->radius*2);

#if 0
	// This cannot happen anymore because this is defined locally in SorcBall
	if (!self->IsKindOf (RUNTIME_CLASS(ASorcBall)))
	{
		I_Error ("Corrupted sorcerer:\nTried to use a %s", self->GetClass()->TypeName.GetChars());
	}
#endif

	if (self->target->health <= 0)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	DAngle prevangle = self->OldAngle;
	DAngle baseangle = parent->BallAngle;
	DAngle angle = baseangle + self->AngleOffset;

	self->Angles.Yaw = angle;

	switch (mode)
	{
	case SORC_NORMAL:			// Balls rotating normally
		self->SorcUpdateBallAngle ();
		break;

	case SORC_DECELERATE:		// Balls decelerating
		A_DecelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_ACCELERATE:		// Balls accelerating
		A_AccelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_STOPPING:			// Balls stopping
		if ((parent->StopBall == self->GetClass()) &&
			 (parent->args[1] > SORCBALL_SPEED_ROTATIONS) &&
			 absangle(angle, parent->Angles.Yaw) < 42.1875)
		{
			// Can stop now
			self->target->args[3] = SORC_FIRESPELL;
			self->target->args[4] = 0;
			// Set angle so self angle == sorcerer angle
			parent->BallAngle = parent->Angles.Yaw - self->AngleOffset;
		}
		else
		{
			self->SorcUpdateBallAngle ();
		}
		break;

	case SORC_FIRESPELL:			// Casting spell
		if (parent->StopBall == self->GetClass())
		{
			// Put sorcerer into special throw spell anim
			if (parent->health > 0)
				parent->SetState (parent->FindState("Attack1"));

			self->DoFireSpell ();
		}
		break;

	case SORC_FIRING_SPELL:
		if (parent->StopBall == self->GetClass())
		{
			if (self->special2-- <= 0)
			{
				// Done rapid firing 
				parent->args[3] = SORC_STOPPED;
				// Back to orbit balls
				if (parent->health > 0)
					parent->SetState (parent->FindState("Attack2"));
			}
			else
			{
				// Do rapid fire spell
				A_SorcOffense2(self);
			}
		}
		break;

	case SORC_STOPPED:			// Balls stopped
	default:
		break;
	}

	if ( angle.BAMs() < prevangle.BAMs() && (parent->args[4]==SORCBALL_TERMINAL_SPEED))
	{
		parent->args[1]++;			// Bump rotation counter
		// Completed full rotation - make woosh sound
		S_Sound (self, CHAN_BODY, "SorcererBallWoosh", 1, ATTN_NORM);
	}
	self->OldAngle = angle;		// Set previous angle

	DVector3 pos = parent->Vec3Angle(dist, angle, -parent->Floorclip + parent->Height);
	self->SetOrigin (pos, true);
	self->floorz = parent->floorz;
	self->ceilingz = parent->ceilingz;
	return 0;
}